

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_fma.cpp
# Opt level: O1

void ncnn::crop_pack8_avx(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  int iVar8;
  undefined8 *puVar9;
  int iVar10;
  
  iVar1 = dst->h;
  if (0 < iVar1) {
    iVar2 = dst->w;
    puVar9 = (undefined8 *)dst->data;
    iVar3 = src->w;
    puVar7 = (undefined8 *)
             ((long)src->data + (long)(left << 3) * 4 + (long)top * (long)iVar3 * src->elemsize);
    iVar8 = 0;
    do {
      iVar10 = iVar2;
      if (0 < iVar2) {
        do {
          uVar4 = puVar7[1];
          uVar5 = puVar7[2];
          uVar6 = puVar7[3];
          *puVar9 = *puVar7;
          puVar9[1] = uVar4;
          puVar9[2] = uVar5;
          puVar9[3] = uVar6;
          puVar7 = puVar7 + 4;
          puVar9 = puVar9 + 4;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      puVar7 = puVar7 + ((long)iVar3 - (long)iVar2) * 4;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  return;
}

Assistant:

static void crop_pack8_avx(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 8;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }

        ptr += (left + right) * 8;
    }
}